

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall
soplex::DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray
          (DataArray<soplex::SPxBasisBase<double>::Desc::Status> *this,
          DataArray<soplex::SPxBasisBase<double>::Desc::Status> *old)

{
  int *in_RSI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *in_RDI;
  
  in_RDI->thesize = *in_RSI;
  in_RDI->themax = in_RSI[1];
  in_RDI->data = (Status *)0x0;
  in_RDI->memFactor = *(Real *)(in_RSI + 4);
  max(in_RDI);
  spx_alloc<soplex::SPxBasisBase<double>::Desc::Status*>((Status **)this,old._4_4_);
  if (in_RDI->thesize != 0) {
    memcpy(in_RDI->data,*(void **)(in_RSI + 2),(ulong)(uint)in_RDI->thesize << 2);
  }
  return;
}

Assistant:

DataArray(const DataArray& old)
      : thesize(old.thesize)
      , themax(old.themax)
      , data(nullptr)
      , memFactor(old.memFactor)
   {
      spx_alloc(data, max());

      assert(thesize >= 0);

      if(thesize)
         memcpy(data, old.data, (unsigned int)thesize * sizeof(T));

      assert(isConsistent());
   }